

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall Memory::LargeHeapBlock::~LargeHeapBlock(LargeHeapBlock *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  HeapAllocator *allocator;
  undefined8 *in_FS_OFFSET;
  
  if (((this->super_HeapBlock).segment != (Segment *)0x0) &&
     ((this->heapInfo->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator.
      super_PageAllocator.isClosed == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0xd2,
                       "(this->segment == nullptr || this->heapInfo->recyclerLargeBlockPageAllocator.IsClosed())"
                       ,"ReleasePages needs to be called before delete");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if (this->pageHeapData != (PageHeapData *)0x0) {
    allocator = HeapAllocator::GetNoMemProtectInstance();
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::PageHeapData>
              (allocator,this->pageHeapData);
    this->pageHeapData = (PageHeapData *)0x0;
  }
  BVSparse<Memory::HeapAllocator>::~BVSparse(&this->wbVerifyBits);
  return;
}

Assistant:

LargeHeapBlock::~LargeHeapBlock()
{
    AssertMsg(this->segment == nullptr || this->heapInfo->recyclerLargeBlockPageAllocator.IsClosed(),
        "ReleasePages needs to be called before delete");
    RECYCLER_PERF_COUNTER_DEC(LargeHeapBlockCount);

#ifdef RECYCLER_PAGE_HEAP
    if (pageHeapData)
    {
        NoMemProtectHeapDelete(pageHeapData);
        pageHeapData = nullptr;
    }
#endif
}